

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassesAndEnums
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  int iVar1;
  Descriptor *desc;
  EnumDescriptor *enumdesc;
  undefined4 local_30;
  undefined4 local_2c;
  int i_1;
  int i;
  FileDescriptor *file_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(file);
    if (iVar1 <= local_2c) break;
    desc = FileDescriptor::message_type(file,local_2c);
    GenerateClass(this,options,printer,desc);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar1 = FileDescriptor::enum_type_count(file);
    if (iVar1 <= local_30) break;
    enumdesc = FileDescriptor::enum_type(file,local_30);
    GenerateEnum(this,options,printer,enumdesc);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Generator::GenerateClassesAndEnums(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const FileDescriptor* file) const {
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateClass(options, printer, file->message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(options, printer, file->enum_type(i));
  }
}